

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O3

bool Potassco::matchAtomArg(char **input,StringSpan *arg)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  
  pbVar1 = (byte *)*input;
  iVar3 = 0;
  pbVar2 = pbVar1;
  do {
    bVar4 = *pbVar2;
    if (bVar4 < 0x29) {
      if (bVar4 == 0x22) {
        bVar4 = pbVar2[1];
        pbVar2 = pbVar2 + 1;
        if ((bVar4 != 0) && (bVar4 != 0x22)) {
          bVar5 = false;
          do {
            bVar6 = bVar4 == 0x5c;
            bVar4 = pbVar2[1];
            pbVar2 = pbVar2 + 1;
            if (bVar4 == 0) break;
            bVar5 = (bool)((bVar5 ^ 1U) & bVar6);
          } while (bVar4 != 0x22 || bVar5);
        }
        if (bVar4 == 0) {
          return false;
        }
      }
      else if (bVar4 == 0x28) {
        iVar3 = iVar3 + 1;
      }
      else if (bVar4 == 0) goto LAB_00195226;
    }
    else if (bVar4 == 0x29) {
      if (iVar3 < 1) {
LAB_00195226:
        arg->first = (char *)pbVar1;
        arg->size = (long)pbVar2 - (long)pbVar1;
        *input = (char *)pbVar2;
        return (long)pbVar2 - (long)pbVar1 != 0;
      }
      iVar3 = iVar3 + -1;
    }
    else if ((bVar4 == 0x2c) && (iVar3 == 0)) goto LAB_00195226;
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

bool matchAtomArg(const char*& input, StringSpan& arg) {
	const char* scan = input;
	for (int p = 0; *scan; ++scan) {
		if      (*scan == '(') { ++p; }
		else if (*scan == ')') { if (--p < 0) { break; } }
		else if (*scan == ',') { if (p == 0) { break; } }
		else if (*scan == '"') {
			bool quoted = false;
			for (++scan; *scan && (*scan != '\"' || quoted); ++scan) {
				quoted = !quoted && *scan == '\\';
			}
			if (!*scan) { return false; }
		}
	}
	arg = toSpan(input, static_cast<std::size_t>(scan - input));
	input = scan;
	return arg.size != 0;
}